

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TessPrimitiveType primType,
          SpacingMode spacing,bool usePointMode)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  byte local_19;
  SpacingMode local_18;
  TessPrimitiveType TStack_14;
  bool usePointMode_local;
  SpacingMode spacing_local;
  TessPrimitiveType primType_local;
  
  TStack_14 = (TessPrimitiveType)this;
  local_19 = (byte)spacing & 1;
  local_18 = primType;
  _spacing_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_e0);
  std::operator+(&local_c0,&local_e0,"layout (");
  pcVar1 = anon_unknown_1::getTessPrimitiveTypeShaderName(TStack_14);
  std::operator+(&local_a0,&local_c0,pcVar1);
  std::operator+(&local_80,&local_a0,", ");
  pcVar1 = anon_unknown_1::getSpacingModeShaderName(local_18);
  std::operator+(&local_60,&local_80,pcVar1);
  pcVar1 = "";
  if ((local_19 & 1) != 0) {
    pcVar1 = ", point_mode";
  }
  std::operator+(&local_40,&local_60,pcVar1);
  std::operator+(__return_storage_ptr__,&local_40,") in;\n");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  return __return_storage_ptr__;
}

Assistant:

static inline string getTessellationEvaluationInLayoutString (TessPrimitiveType primType, SpacingMode spacing, bool usePointMode=false)
{
	return string() + "layout (" + getTessPrimitiveTypeShaderName(primType)
								 + ", " + getSpacingModeShaderName(spacing)
								 + (usePointMode ? ", point_mode" : "")
								 + ") in;\n";
}